

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall Uniforms::set(Uniforms *this,string *_name,float _x,float _y,float _z)

{
  float fVar1;
  float fVar2;
  reference pvVar3;
  mapped_type *this_00;
  undefined1 local_34 [8];
  UniformValue value;
  float _z_local;
  float _y_local;
  float _x_local;
  string *_name_local;
  Uniforms *this_local;
  
  value._M_elems[2] = _z;
  value._M_elems[3] = _y;
  pvVar3 = std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_34,0);
  fVar2 = value._M_elems[3];
  *pvVar3 = _x;
  pvVar3 = std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_34,1);
  fVar1 = value._M_elems[2];
  *pvVar3 = fVar2;
  pvVar3 = std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_34,2);
  *pvVar3 = fVar1;
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
            ::operator[](&this->data,_name);
  UniformData::set(this_00,(UniformValue *)local_34,3,false,true);
  this->m_change = true;
  return;
}

Assistant:

void Uniforms::set(const std::string& _name, float _x, float _y, float _z) {
    UniformValue value;
    value[0] = _x;
    value[1] = _y;
    value[2] = _z;
    data[_name].set(value, 3, false);
    m_change = true;
}